

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O2

string * __thiscall
Lodtalk::Class::getNameString_abi_cxx11_(string *__return_storage_ptr__,Class *this)

{
  ObjectHeader *this_00;
  allocator *paVar1;
  char *pcVar2;
  allocator local_a;
  allocator local_9;
  
  this_00 = (this->name).field_0.header;
  if (this_00 == (ObjectHeader *)0x0) {
    pcVar2 = "uninitialized";
    paVar1 = &local_9;
  }
  else {
    if (this_00 != (ObjectHeader *)&NilObject) {
      ByteSymbol::getString_abi_cxx11_(__return_storage_ptr__,(ByteSymbol *)this_00);
      return __return_storage_ptr__;
    }
    pcVar2 = "UnknownClass";
    paVar1 = &local_a;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Class::getNameString()
{
	if(!name.pointer)
		return "uninitialized";
	if(name.isNil())
		return "UnknownClass";

	ByteSymbol *nameSymbol = reinterpret_cast<ByteSymbol *> (name.pointer);
	return nameSymbol->getString();
}